

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalOperationalData.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::FundamentalOperationalData::Decode
          (FundamentalOperationalData *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  FundamentalOperationalData *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x10) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>(local_18,(uchar *)&this->field_0);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->field_0).field_0.m_ui8AltParam4);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->field_0).field_0.m_ui8InfoLayers);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->field_0).field_0.m_ui8Modifier);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->field_0).field_0.m_ui16Param1);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->field_0).field_0.m_ui16Param2);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->field_0).field_0.m_ui16Param3);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->field_0).field_0.m_ui16Param4);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->field_0).field_0.m_ui16Param5);
  KDataStream::operator>>(pKVar2,&(this->field_0).field_0.m_ui16Param6);
  return;
}

Assistant:

void FundamentalOperationalData::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < FUNDAMENTAL_OPERATIONAL_DATA_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8SystemStatus
           >> m_ui8AltParam4
           >> m_ui8InfoLayers
           >> m_ui8Modifier
           >> m_ui16Param1
           >> m_ui16Param2
           >> m_ui16Param3
           >> m_ui16Param4
           >> m_ui16Param5
           >> m_ui16Param6;
}